

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

void __thiscall Lodtalk::AST::PragmaDefinition::~PragmaDefinition(PragmaDefinition *this)

{
  pointer ppNVar1;
  pointer pcVar2;
  pointer ppNVar3;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__PragmaDefinition_00164268;
  ppNVar1 = (this->parameters).
            super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar3 = (this->parameters).
                 super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppNVar3 != ppNVar1; ppNVar3 = ppNVar3 + 1
      ) {
    if (*ppNVar3 != (Node *)0x0) {
      (*(*ppNVar3)->_vptr_Node[1])();
    }
  }
  ppNVar3 = (this->parameters).
            super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar3 != (pointer)0x0) {
    operator_delete(ppNVar3);
  }
  pcVar2 = (this->selector)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->selector).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

PragmaDefinition::~PragmaDefinition()
{
    for(auto param : parameters)
        delete param;
}